

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O3

void DBaseDecal::SpreadLeft(double r,vertex_t *v1,side_t *feelwall,F3DFloor *ffloor)

{
  DVector2 *pDVar1;
  double dVar2;
  double dVar3;
  side_t *psVar4;
  DVector2 *pDVar5;
  long lVar6;
  ulong uVar7;
  line_t_conflict *plVar8;
  side_t *feelwall_00;
  bool bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double startr;
  double local_60;
  
  TArray<side_t_*,_side_t_*>::Grow(&SpreadStack,1);
  SpreadStack.Array[SpreadStack.Count] = feelwall;
  SpreadStack.Count = SpreadStack.Count + 1;
  local_60 = r;
  if (r < 0.0) {
    do {
      uVar7 = (ulong)feelwall->LeftSide;
      if (uVar7 == 0xffffffff) {
        return;
      }
      feelwall = sides + uVar7;
      plVar8 = sides[uVar7].linedef;
      if (plVar8->sidedef[0] == feelwall) {
        dVar10 = (plVar8->delta).X;
        dVar12 = (plVar8->delta).Y;
      }
      else {
        pDVar1 = &plVar8->delta;
        pDVar5 = &plVar8->delta;
        plVar8 = (line_t_conflict *)&plVar8->v2;
        dVar10 = -pDVar1->X;
        dVar12 = -pDVar5->Y;
      }
      dVar2 = (v1->p).X;
      dVar3 = (v1->p).Y;
      v1 = plVar8->v1;
      dVar11 = c_sqrt(dVar12 * dVar12 + dVar10 * dVar10);
      (*(SpreadSource->super_DThinker).super_DObject._vptr_DObject[10])
                ((dVar10 * (DecalLeft + local_60)) / dVar11 + dVar2,
                 (dVar12 * (DecalLeft + local_60)) / dVar11 + dVar3,SpreadZ,SpreadSource,
                 SpreadTemplate,feelwall,ffloor);
      TArray<side_t_*,_side_t_*>::Grow(&SpreadStack,1);
      SpreadStack.Array[SpreadStack.Count] = feelwall;
      SpreadStack.Count = SpreadStack.Count + 1;
      psVar4 = feelwall->linedef->sidedef[0];
      feelwall_00 = feelwall->linedef->sidedef[1];
      if (psVar4 == feelwall) {
        if (feelwall_00 != (side_t *)0x0) goto LAB_004b34de;
      }
      else {
        bVar9 = feelwall_00 == feelwall;
        feelwall_00 = psVar4;
        if (psVar4 != (side_t *)0x0 && bVar9) {
LAB_004b34de:
          if (feelwall_00->LeftSide != 0xffffffff) {
            uVar7 = (ulong)SpreadStack.Count;
            do {
              if ((int)uVar7 < 1) {
                if (uVar7 == 0) {
                  SpreadLeft(local_60,*(vertex_t **)
                                       (feelwall_00->linedef->args +
                                       (ulong)(feelwall_00->linedef->sidedef[0] != feelwall_00) * 2
                                       + -0xb),feelwall_00,ffloor);
                }
                break;
              }
              lVar6 = uVar7 - 1;
              uVar7 = uVar7 - 1;
            } while (SpreadStack.Array[lVar6] != feelwall_00);
          }
        }
      }
      local_60 = local_60 + dVar11;
    } while (local_60 < 0.0);
  }
  return;
}

Assistant:

void DBaseDecal::SpreadLeft (double r, vertex_t *v1, side_t *feelwall, F3DFloor *ffloor)
{
	double ldx, ldy;

	SpreadStack.Push (feelwall);

	while (r < 0 && feelwall->LeftSide != NO_SIDE)
	{
		double startr = r;

		double x = v1->fX();
		double y = v1->fY();

		feelwall = &sides[feelwall->LeftSide];
		GetWallStuff (feelwall, v1, ldx, ldy);
		double wallsize = Length (ldx, ldy);
		r += DecalLeft;
		x += r*ldx / wallsize;
		y += r*ldy / wallsize;
		r = wallsize + startr;
		SpreadSource->CloneSelf (SpreadTemplate, x, y, SpreadZ, feelwall, ffloor);
		SpreadStack.Push (feelwall);

		side_t *nextwall = NextWall (feelwall);
		if (nextwall != NULL && nextwall->LeftSide != NO_SIDE)
		{
			int i;

			for (i = SpreadStack.Size(); i-- > 0; )
			{
				if (SpreadStack[i] == nextwall)
					break;
			}
			if (i == -1)
			{
				vertex_t *v2;

				GetWallStuff (nextwall, v2, ldx, ldy);
				SpreadLeft (startr, v2, nextwall, ffloor);
			}
		}
	}
}